

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBindingShaderAccessTests.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::BindingModel::anon_unknown_1::TexelBufferRenderInstance::verifyResultImage
          (TestStatus *__return_storage_ptr__,TexelBufferRenderInstance *this,
          ConstPixelBufferAccess *result)

{
  TextureFormat TVar1;
  VkShaderStageFlags VVar2;
  TestLog *log;
  int iVar3;
  bool bVar4;
  int iVar5;
  void *data;
  Surface reference;
  Vec4 sample3;
  Vec4 sample2;
  Vec4 sample1;
  Vec4 sample0;
  ConstPixelBufferAccess local_b8;
  TextureFormat local_90;
  Surface local_88;
  undefined1 local_70 [16];
  undefined1 local_60 [16];
  Vec4 local_50;
  TextureFormat local_40;
  int aiStack_38 [2];
  
  VVar2 = this->m_stageFlags;
  iVar3 = (int)this;
  if (VVar2 == 0) {
    local_40.order = 0x3f800000;
    local_40.type = 0x3f800000;
    aiStack_38[0] = 0;
    aiStack_38[1] = 0x3f800000;
    local_50.m_data[0] = 0.0;
    local_50.m_data[1] = 1.0;
    local_50.m_data[2] = 0.0;
    local_50.m_data[3] = 1.0;
  }
  else {
    tcu::ConstPixelBufferAccess::getPixel((ConstPixelBufferAccess *)&local_40,iVar3 + 0x220,6,0);
    iVar5 = iVar3 + 0x248;
    if ((this->m_texelBuffers).m_numTexelBuffers == 1) {
      iVar5 = iVar3 + 0x220;
    }
    tcu::ConstPixelBufferAccess::getPixel((ConstPixelBufferAccess *)&local_50,iVar5,0x33,0);
  }
  if (VVar2 == 0) {
    local_60._0_4_ = R;
    local_60._4_4_ = 0x3f800000;
    local_60._8_4_ = 0;
    local_60._12_4_ = 0x3f800000;
    local_70._0_4_ = 0x3f800000;
    local_70._4_4_ = 0x3f800000;
    local_70._8_4_ = 0;
    local_70._12_4_ = 0x3f800000;
  }
  else {
    tcu::ConstPixelBufferAccess::getPixel((ConstPixelBufferAccess *)local_60,iVar3 + 0x220,0x2a,0);
    iVar5 = iVar3 + 0x248;
    if ((this->m_texelBuffers).m_numTexelBuffers == 1) {
      iVar5 = iVar3 + 0x220;
    }
    tcu::ConstPixelBufferAccess::getPixel((ConstPixelBufferAccess *)local_70,iVar5,0x19,0);
  }
  tcu::Surface::Surface
            (&local_88,
             (this->super_SingleCmdRenderInstance).super_SingleTargetRenderInstance.m_targetSize.
             m_data[0],
             (this->super_SingleCmdRenderInstance).super_SingleTargetRenderInstance.m_targetSize.
             m_data[1]);
  local_90.order = RGBA;
  local_90.type = UNORM_INT8;
  data = (void *)local_88.m_pixels.m_cap;
  if ((void *)local_88.m_pixels.m_cap != (void *)0x0) {
    data = local_88.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)&local_b8,&local_90,local_88.m_width,local_88.m_height,1,data);
  drawQuadrantReferenceResult
            ((PixelBufferAccess *)&local_b8,(Vec4 *)&local_40,&local_50,(Vec4 *)local_60,
             (Vec4 *)local_70);
  log = ((this->super_SingleCmdRenderInstance).super_SingleTargetRenderInstance.super_TestInstance.
        m_context)->m_testCtx->m_log;
  local_90.order = RGBA;
  local_90.type = UNORM_INT8;
  if ((void *)local_88.m_pixels.m_cap != (void *)0x0) {
    local_88.m_pixels.m_cap = (size_t)local_88.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)&local_b8,&local_90,local_88.m_width,local_88.m_height,1,
             (void *)local_88.m_pixels.m_cap);
  bVar4 = tcu::bilinearCompare
                    (log,"Compare","Result comparison",&local_b8,result,(RGBA)0x1010101,
                     COMPARE_LOG_RESULT);
  TVar1 = (TextureFormat)(local_b8.m_size.m_data + 2);
  local_b8.m_format = TVar1;
  if (bVar4) {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"Pass","");
    __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,local_b8.m_format,
               (undefined1 *)(local_b8.m_size.m_data._0_8_ + (long)local_b8.m_format));
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b8,"Image verification failed","");
    __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,local_b8.m_format,
               (undefined1 *)(local_b8.m_size.m_data._0_8_ + (long)local_b8.m_format));
  }
  if (local_b8.m_format != TVar1) {
    operator_delete((void *)local_b8.m_format,local_b8._16_8_ + 1);
  }
  tcu::Surface::~Surface(&local_88);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus TexelBufferRenderInstance::verifyResultImage (const tcu::ConstPixelBufferAccess& result) const
{
	const tcu::Vec4		green		(0.0f, 1.0f, 0.0f, 1.0f);
	const tcu::Vec4		yellow		(1.0f, 1.0f, 0.0f, 1.0f);
	const bool			doFetch		= (m_stageFlags != 0u); // no active stages? Then don't fetch
	const tcu::Vec4		sample0		= (!doFetch) ? (yellow)	: (m_texelBuffers.fetchTexelValue(0));
	const tcu::Vec4		sample1		= (!doFetch) ? (green)	: (m_texelBuffers.fetchTexelValue(1));
	const tcu::Vec4		sample2		= (!doFetch) ? (green)	: (m_texelBuffers.fetchTexelValue(2));
	const tcu::Vec4		sample3		= (!doFetch) ? (yellow)	: (m_texelBuffers.fetchTexelValue(3));
	tcu::Surface		reference	(m_targetSize.x(), m_targetSize.y());

	drawQuadrantReferenceResult(reference.getAccess(), sample0, sample1, sample2, sample3);

	if (!bilinearCompare(m_context.getTestContext().getLog(), "Compare", "Result comparison", reference.getAccess(), result, tcu::RGBA(1, 1, 1, 1), tcu::COMPARE_LOG_RESULT))
		return tcu::TestStatus::fail("Image verification failed");
	else
		return tcu::TestStatus::pass("Pass");
}